

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virgo.h
# Opt level: O0

ostream * virgo::operator<<(ostream *output,Chessboard *board)

{
  pair<virgo::Piece,_virgo::Player> *ppVar1;
  ostream *poVar2;
  Piece local_5c;
  pair<virgo::Piece,_virgo::Player> p;
  int file;
  int row;
  allocator local_39;
  string local_38 [8];
  string grid;
  Chessboard *board_local;
  ostream *output_local;
  
  grid.field_2._8_8_ = board;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"      A   B   C   D   E   F   G   H  \n",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::append((char *)local_38);
  for (p.second = BLACK; (int)p.second < 8; p.second = p.second + WHITE) {
    std::__cxx11::string::push_back((char)local_38);
    std::__cxx11::string::append((char *)local_38);
    for (p.first = PAWN; (int)p.first < 8; p.first = p.first + ROOK) {
      ppVar1 = Chessboard::operator[]((Chessboard *)grid.field_2._8_8_,p.first + (7 - p.second) * 8)
      ;
      local_5c = (*ppVar1).first;
      if (local_5c == EMPTY) {
        std::__cxx11::string::push_back((char)local_38);
      }
      else {
        std::__cxx11::string::push_back((char)local_38);
      }
      std::__cxx11::string::append((char *)local_38);
    }
    std::__cxx11::string::append((char *)local_38);
    std::__cxx11::string::push_back((char)local_38);
    std::__cxx11::string::push_back((char)local_38);
    std::__cxx11::string::append((char *)local_38);
  }
  std::__cxx11::string::append((char *)local_38);
  poVar2 = std::operator<<(output,local_38);
  std::__cxx11::string::~string(local_38);
  return poVar2;
}

Assistant:

inline std::ostream & operator << (std::ostream & output, const Chessboard & board){
        static uint8_t pieceIcons[12] = {'p', 'r', 'n', 'b', 'k', 'q', 'P', 'R', 'N', 'B', 'K', 'Q'};

        std::string grid = "      A   B   C   D   E   F   G   H  \n";
        grid.append("    +---+---+---+---+---+---+---+---+ \n");

        for(int row = 0; row < 8; row++) {
            grid.push_back('8' - row);
            grid.append("   | ");
            for (int file = 0; file < 8; file++) {
                std::pair<Piece, Player> p = board[file + (7-row) * 8];
                if(p.first == EMPTY) grid.push_back(' ');
                else grid.push_back(pieceIcons[p.second * 6 + p.first]);
                grid.append(" | ");
            }
            grid.append("  ");
            grid.push_back('8' - row);
            grid.push_back('\n');
            grid.append("    +---+---+---+---+---+---+---+---+    \n");
        }

        grid.append("      A   B   C   D   E   F   G   H  \n");
        return output << grid;
    }